

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O0

gme_err_t gme_identify_file(char *path,gme_type_t *type_out)

{
  bool bVar1;
  int iVar2;
  gme_type_t __nbytes;
  undefined4 extraout_var;
  gme_err_t pcVar3;
  char *extension_;
  int __oflag;
  long *in_RSI;
  char *in_RDI;
  blargg_err_t blargg_return_err__1;
  blargg_err_t blargg_return_err_;
  Std_File_Reader in;
  char header [4];
  void *in_stack_ffffffffffffff88;
  gme_type_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  Std_File_Reader local_30;
  undefined1 local_1c [4];
  long *local_18;
  char *local_10;
  gme_err_t local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  __nbytes = gme_identify_extension(in_stack_ffffffffffffff98);
  *local_18 = (long)__nbytes;
  if (*local_18 == 0) {
    Std_File_Reader::Std_File_Reader((Std_File_Reader *)in_stack_ffffffffffffff90);
    iVar2 = Std_File_Reader::open(&local_30,local_10,__oflag);
    if ((gme_err_t)CONCAT44(extraout_var,iVar2) == (gme_err_t)0x0) {
      pcVar3 = (gme_err_t)
               Std_File_Reader::read(&local_30,(int)local_1c,(void *)0x4,(size_t)__nbytes);
      if (pcVar3 == (gme_err_t)0x0) {
        extension_ = gme_identify_header(in_stack_ffffffffffffff88);
        in_stack_ffffffffffffff90 = gme_identify_extension(extension_);
        *local_18 = (long)in_stack_ffffffffffffff90;
        bVar1 = false;
      }
      else {
        bVar1 = true;
        local_8 = pcVar3;
      }
    }
    else {
      bVar1 = true;
      local_8 = (gme_err_t)CONCAT44(extraout_var,iVar2);
    }
    Std_File_Reader::~Std_File_Reader((Std_File_Reader *)in_stack_ffffffffffffff90);
    if (bVar1) {
      return local_8;
    }
  }
  return (gme_err_t)0x0;
}

Assistant:

BLARGG_EXPORT gme_err_t gme_identify_file( const char* path, gme_type_t* type_out )
{
	*type_out = gme_identify_extension( path );
	// TODO: don't examine header if file has extension?
	if ( !*type_out )
	{
		char header [4];
		GME_FILE_READER in;
		RETURN_ERR( in.open( path ) );
		RETURN_ERR( in.read( header, sizeof header ) );
		*type_out = gme_identify_extension( gme_identify_header( header ) );
	}
	return 0;   
}